

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreplyhttpimpl_p.cpp
# Opt level: O0

void QNetworkReplyHttpImpl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QNetworkReplyHttpImplPrivate *pQVar2;
  QMetaType QVar3;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QNetworkReplyHttpImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyHttpImpl *_t;
  undefined4 in_stack_fffffffffffffec8;
  NetworkError in_stack_fffffffffffffecc;
  QNetworkReplyHttpImplPrivate *in_stack_fffffffffffffed0;
  QList<QSslError> *in_stack_fffffffffffffed8;
  QNetworkReplyHttpImplPrivate *in_stack_fffffffffffffee8;
  QNetworkReplyHttpImplPrivate *in_stack_fffffffffffffef0;
  QNetworkReplyHttpImplPrivate *in_stack_fffffffffffffef8;
  QAuthenticator *in_stack_ffffffffffffff00;
  QNetworkReplyHttpImplPrivate *in_stack_ffffffffffffff08;
  QNetworkReplyHttpImplPrivate *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff20;
  QUrl *in_stack_ffffffffffffff28;
  QNetworkReplyHttpImplPrivate *in_stack_ffffffffffffff30;
  QByteArray *in_stack_ffffffffffffff40;
  QMetaType local_90;
  QMetaTypeInterface *local_88;
  QMetaType local_80;
  QMetaTypeInterface *local_78;
  QMetaType local_70;
  QMetaTypeInterface *local_68;
  QMetaType local_60;
  QMetaTypeInterface *local_58;
  QMetaType local_50;
  QMetaTypeInterface *local_48;
  QMetaType local_40;
  QMetaTypeInterface *local_38;
  QMetaType local_30;
  QMetaType local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    pQVar2 = (QNetworkReplyHttpImplPrivate *)(ulong)in_EDX;
    switch(pQVar2) {
    case (QNetworkReplyHttpImplPrivate *)0x0:
      startHttpRequest((QNetworkReplyHttpImpl *)0x31f8e1);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x1:
      abortHttpRequest((QNetworkReplyHttpImpl *)0x31f8f3);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x2:
      readBufferSizeChanged
                ((QNetworkReplyHttpImpl *)0x31f914,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      break;
    case (QNetworkReplyHttpImplPrivate *)0x3:
      readBufferFreed((QNetworkReplyHttpImpl *)0x31f935,
                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      break;
    case (QNetworkReplyHttpImplPrivate *)0x4:
      startHttpRequestSynchronously((QNetworkReplyHttpImpl *)0x31f947);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x5:
      haveUploadData((QNetworkReplyHttpImpl *)pQVar2,(qint64)in_stack_fffffffffffffef8,
                     (QByteArray *)in_stack_fffffffffffffed8,
                     SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0),
                     (qint64)in_stack_fffffffffffffee8);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x6:
      d_func((QNetworkReplyHttpImpl *)0x31f9a8);
      QNetworkReplyHttpImplPrivate::_q_startOperation(in_stack_fffffffffffffed0);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x7:
      d_func((QNetworkReplyHttpImpl *)0x31f9c2);
      QNetworkReplyHttpImplPrivate::_q_cacheLoadReadyRead(in_stack_ffffffffffffff08);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x8:
      d_func((QNetworkReplyHttpImpl *)0x31f9dc);
      QNetworkReplyHttpImplPrivate::_q_bufferOutgoingData(in_stack_fffffffffffffee8);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x9:
      d_func((QNetworkReplyHttpImpl *)0x31f9f6);
      QNetworkReplyHttpImplPrivate::_q_bufferOutgoingDataFinished(in_stack_fffffffffffffed0);
      break;
    case (QNetworkReplyHttpImplPrivate *)0xa:
      d_func((QNetworkReplyHttpImpl *)0x31fa10);
      QNetworkReplyHttpImplPrivate::_q_transferTimedOut(in_stack_fffffffffffffed0);
      break;
    case (QNetworkReplyHttpImplPrivate *)0xb:
      d_func((QNetworkReplyHttpImpl *)0x31fa2a);
      QNetworkReplyHttpImplPrivate::_q_finished((QNetworkReplyHttpImplPrivate *)0x31fa32);
      break;
    case (QNetworkReplyHttpImplPrivate *)0xc:
      d_func((QNetworkReplyHttpImpl *)0x31fa44);
      QNetworkReplyHttpImplPrivate::_q_error
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,(QString *)0x31fa66);
      break;
    case (QNetworkReplyHttpImplPrivate *)0xd:
      d_func((QNetworkReplyHttpImpl *)0x31fa78);
      QByteArray::QByteArray
                ((QByteArray *)in_stack_fffffffffffffed0,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      QNetworkReplyHttpImplPrivate::replyDownloadData(in_RDI,in_stack_ffffffffffffff40);
      QByteArray::~QByteArray((QByteArray *)0x31fab5);
      break;
    case (QNetworkReplyHttpImplPrivate *)0xe:
      d_func((QNetworkReplyHttpImpl *)0x31fac7);
      QNetworkReplyHttpImplPrivate::replyFinished(in_stack_fffffffffffffed0);
      break;
    case (QNetworkReplyHttpImplPrivate *)0xf:
      d_func((QNetworkReplyHttpImpl *)0x31fae1);
      QNetworkReplyHttpImplPrivate::replyDownloadProgressSlot
                (in_stack_fffffffffffffef0,(qint64)in_stack_fffffffffffffee8,(qint64)pQVar2);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x10:
      d_func((QNetworkReplyHttpImpl *)0x31fb19);
      QNetworkReplyHttpImplPrivate::httpAuthenticationRequired
                (in_stack_ffffffffffffff10,(QHttpNetworkRequest *)in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x11:
      d_func((QNetworkReplyHttpImpl *)0x31fb4e);
      QNetworkReplyHttpImplPrivate::httpError
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,(QString *)0x31fb70);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x12:
      d_func((QNetworkReplyHttpImpl *)0x31fb82);
      QNetworkReplyHttpImplPrivate::replyEncrypted(in_stack_fffffffffffffed0);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x13:
      d_func((QNetworkReplyHttpImpl *)0x31fb9c);
      QNetworkReplyHttpImplPrivate::replySslErrors
                (in_stack_fffffffffffffef0,(QList<QSslError> *)in_stack_fffffffffffffee8,
                 (bool *)pQVar2,in_stack_fffffffffffffed8);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x14:
      d_func((QNetworkReplyHttpImpl *)0x31fbe0);
      QNetworkReplyHttpImplPrivate::replySslConfigurationChanged
                (in_stack_fffffffffffffef0,(QSslConfiguration *)in_stack_fffffffffffffee8);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x15:
      d_func((QNetworkReplyHttpImpl *)0x31fc06);
      QNetworkReplyHttpImplPrivate::replyPreSharedKeyAuthenticationRequiredSlot
                (in_stack_fffffffffffffed0,
                 (QSslPreSharedKeyAuthenticator *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      break;
    case (QNetworkReplyHttpImplPrivate *)0x16:
      d_func((QNetworkReplyHttpImpl *)0x31fc2f);
      QNetworkReplyHttpImplPrivate::proxyAuthenticationRequired
                (in_stack_fffffffffffffef0,(QNetworkProxy *)in_stack_fffffffffffffee8,
                 (QAuthenticator *)pQVar2);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x17:
      d_func((QNetworkReplyHttpImpl *)0x31fc64);
      QNetworkReplyHttpImplPrivate::resetUploadDataSlot
                (in_stack_fffffffffffffed0,
                 (bool *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      break;
    case (QNetworkReplyHttpImplPrivate *)0x18:
      d_func((QNetworkReplyHttpImpl *)0x31fc8d);
      QNetworkReplyHttpImplPrivate::wantUploadDataSlot
                (in_stack_fffffffffffffef8,(qint64)in_stack_fffffffffffffef0);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x19:
      d_func((QNetworkReplyHttpImpl *)0x31fcb6);
      QNetworkReplyHttpImplPrivate::sentUploadDataSlot
                (pQVar2,(qint64)in_stack_fffffffffffffed8,(qint64)in_stack_fffffffffffffed0);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x1a:
      d_func((QNetworkReplyHttpImpl *)0x31fcee);
      QNetworkReplyHttpImplPrivate::uploadByteDeviceReadyReadSlot(in_stack_fffffffffffffed0);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x1b:
      d_func((QNetworkReplyHttpImpl *)0x31fd08);
      QNetworkReplyHttpImplPrivate::emitReplyUploadProgress
                (pQVar2,(qint64)in_stack_fffffffffffffed8,(qint64)in_stack_fffffffffffffed0);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x1c:
      pQVar2 = d_func((QNetworkReplyHttpImpl *)0x31fd40);
      QNetworkReplyHttpImplPrivate::_q_cacheSaveDeviceAboutToClose(pQVar2);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x1d:
      d_func((QNetworkReplyHttpImpl *)0x31fd57);
      QNetworkReplyHttpImplPrivate::_q_metaDataChanged(in_stack_fffffffffffffef8);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x1e:
      d_func((QNetworkReplyHttpImpl *)0x31fd6e);
      QNetworkReplyHttpImplPrivate::onRedirected
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(int)in_stack_ffffffffffffff20);
      break;
    case (QNetworkReplyHttpImplPrivate *)0x1f:
      d_func((QNetworkReplyHttpImpl *)0x31fdad);
      QNetworkReplyHttpImplPrivate::followRedirect(in_stack_fffffffffffffed0);
    }
  }
  if (in_ESI == 7) {
    switch(in_EDX) {
    case 0xc:
      if (**(int **)(in_RCX + 8) == 0) {
        local_38 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = local_38;
      }
      else {
        memset(&local_30,0,8);
        QMetaType::QMetaType(&local_30);
        **(undefined8 **)in_RCX = local_30.d_ptr;
      }
      break;
    default:
      memset(local_28,0,8);
      QMetaType::QMetaType(local_28);
      **(undefined8 **)in_RCX = local_28[0].d_ptr;
      break;
    case 0x10:
      if (**(int **)(in_RCX + 8) == 0) {
        local_48 = (QMetaTypeInterface *)QMetaType::fromType<QHttpNetworkRequest>();
        **(undefined8 **)in_RCX = local_48;
      }
      else {
        memset(&local_40,0,8);
        QMetaType::QMetaType(&local_40);
        **(undefined8 **)in_RCX = local_40.d_ptr;
      }
      break;
    case 0x11:
      if (**(int **)(in_RCX + 8) == 0) {
        local_58 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = local_58;
      }
      else {
        memset(&local_50,0,8);
        QMetaType::QMetaType(&local_50);
        **(undefined8 **)in_RCX = local_50.d_ptr;
      }
      break;
    case 0x13:
      if (**(int **)(in_RCX + 8) == 0) {
        local_68 = (QMetaTypeInterface *)QMetaType::fromType<QList<QSslError>>();
        **(undefined8 **)in_RCX = local_68;
      }
      else {
        memset(&local_60,0,8);
        QMetaType::QMetaType(&local_60);
        **(undefined8 **)in_RCX = local_60.d_ptr;
      }
      break;
    case 0x14:
      if (**(int **)(in_RCX + 8) == 0) {
        local_78 = (QMetaTypeInterface *)QMetaType::fromType<QSslConfiguration>();
        **(undefined8 **)in_RCX = local_78;
      }
      else {
        memset(&local_70,0,8);
        QMetaType::QMetaType(&local_70);
        **(undefined8 **)in_RCX = local_70.d_ptr;
      }
      break;
    case 0x15:
      if (**(int **)(in_RCX + 8) == 0) {
        local_88 = (QMetaTypeInterface *)QMetaType::fromType<QSslPreSharedKeyAuthenticator*>();
        **(undefined8 **)in_RCX = local_88;
      }
      else {
        memset(&local_80,0,8);
        QMetaType::QMetaType(&local_80);
        **(undefined8 **)in_RCX = local_80.d_ptr;
      }
      break;
    case 0x16:
      if (**(int **)(in_RCX + 8) == 0) {
        QVar3 = QMetaType::fromType<QNetworkProxy>();
        **(undefined8 **)in_RCX = QVar3.d_ptr;
      }
      else {
        memset(&local_90,0,8);
        QMetaType::QMetaType(&local_90);
        **(undefined8 **)in_RCX = local_90.d_ptr;
      }
    }
  }
  if ((((in_ESI == 5) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReplyHttpImpl::*)()>
                          (in_RCX,(void **)startHttpRequest,0,0), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReplyHttpImpl::*)()>
                         (in_RCX,(void **)abortHttpRequest,0,1), !bVar1)) &&
     (((bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReplyHttpImpl::*)(long_long)>
                          (in_RCX,(void **)readBufferSizeChanged,0,2), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReplyHttpImpl::*)(long_long)>
                          (in_RCX,(void **)readBufferFreed,0,3), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReplyHttpImpl::*)()>
                         (in_RCX,(void **)startHttpRequestSynchronously,0,4), !bVar1)))) {
    QtMocHelpers::
    indexOfMethod<void(QNetworkReplyHttpImpl::*)(long_long,QByteArray_const&,bool,long_long)>
              (in_RCX,(void **)haveUploadData,0,5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImpl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkReplyHttpImpl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->startHttpRequest(); break;
        case 1: _t->abortHttpRequest(); break;
        case 2: _t->readBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 3: _t->readBufferFreed((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 4: _t->startHttpRequestSynchronously(); break;
        case 5: _t->haveUploadData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[4]))); break;
        case 6: _t->d_func()->_q_startOperation(); break;
        case 7: _t->d_func()->_q_cacheLoadReadyRead(); break;
        case 8: _t->d_func()->_q_bufferOutgoingData(); break;
        case 9: _t->d_func()->_q_bufferOutgoingDataFinished(); break;
        case 10: _t->d_func()->_q_transferTimedOut(); break;
        case 11: _t->d_func()->_q_finished(); break;
        case 12: _t->d_func()->_q_error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 13: _t->d_func()->replyDownloadData((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1]))); break;
        case 14: _t->d_func()->replyFinished(); break;
        case 15: _t->d_func()->replyDownloadProgressSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 16: _t->d_func()->httpAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 17: _t->d_func()->httpError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 18: _t->d_func()->replyEncrypted(); break;
        case 19: _t->d_func()->replySslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool*>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>*>>(_a[3]))); break;
        case 20: _t->d_func()->replySslConfigurationChanged((*reinterpret_cast< std::add_pointer_t<QSslConfiguration>>(_a[1]))); break;
        case 21: _t->d_func()->replyPreSharedKeyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 22: _t->d_func()->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 23: _t->d_func()->resetUploadDataSlot((*reinterpret_cast< std::add_pointer_t<bool*>>(_a[1]))); break;
        case 24: _t->d_func()->wantUploadDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 25: _t->d_func()->sentUploadDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 26: _t->d_func()->uploadByteDeviceReadyReadSlot(); break;
        case 27: _t->d_func()->emitReplyUploadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 28: _t->d_func()->_q_cacheSaveDeviceAboutToClose(); break;
        case 29: _t->d_func()->_q_metaDataChanged(); break;
        case 30: _t->d_func()->onRedirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 31: _t->d_func()->followRedirect(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 12:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 16:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 19:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 20:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslConfiguration >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 22:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::startHttpRequest, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::abortHttpRequest, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(qint64 )>(_a, &QNetworkReplyHttpImpl::readBufferSizeChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(qint64 )>(_a, &QNetworkReplyHttpImpl::readBufferFreed, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::startHttpRequestSynchronously, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(const qint64 , const QByteArray & , bool , qint64 )>(_a, &QNetworkReplyHttpImpl::haveUploadData, 5))
            return;
    }
}